

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O1

ANNpointArray annAllocPts(int n,int dim)

{
  ANNpointArray ppAVar1;
  ANNpoint pAVar2;
  ulong uVar3;
  
  uVar3 = (long)n * 8;
  if (n < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppAVar1 = (ANNpointArray)operator_new__(uVar3);
  uVar3 = (long)(dim * n) * 8;
  if (dim * n < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pAVar2 = (ANNpoint)operator_new__(uVar3);
  if (0 < n) {
    uVar3 = 0;
    do {
      ppAVar1[uVar3] = pAVar2;
      uVar3 = uVar3 + 1;
      pAVar2 = pAVar2 + dim;
    } while ((uint)n != uVar3);
  }
  return ppAVar1;
}

Assistant:

ANNpointArray annAllocPts(int n, int dim)  // allocate n pts in dim
{
    ANNpointArray pa = new ANNpoint[n];  // allocate points
    ANNpoint p = new ANNcoord[n * dim];  // allocate space for coords
    for (int i = 0; i < n; i++) {
        pa[i] = &(p[i * dim]);
    }
    return pa;
}